

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_check_pubkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  size_t sVar2;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = rsa_check_context((mbedtls_rsa_context *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if ((((iVar1 == 0) && (sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)0x865e04), 0x7f < sVar2)) &&
      (iVar1 = mbedtls_mpi_get_bit((mbedtls_mpi *)(in_RDI + 0x20),0), iVar1 != 0)) &&
     ((sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)0x865e3b), 1 < sVar2 &&
      (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)(in_RDI + 0x20),(mbedtls_mpi *)(in_RDI + 0x10)),
      iVar1 < 0)))) {
    return 0;
  }
  return -0x4200;
}

Assistant:

int mbedtls_rsa_check_pubkey(const mbedtls_rsa_context *ctx)
{
    if (rsa_check_context(ctx, 0 /* public */, 0 /* no blinding */) != 0) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    if (mbedtls_mpi_bitlen(&ctx->N) < 128) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    if (mbedtls_mpi_get_bit(&ctx->E, 0) == 0 ||
        mbedtls_mpi_bitlen(&ctx->E)     < 2  ||
        mbedtls_mpi_cmp_mpi(&ctx->E, &ctx->N) >= 0) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    return 0;
}